

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall Printer::printBoard(Printer *this,Board *board,Player *player1)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  Cell *pCVar5;
  Player *pPVar6;
  int local_a8;
  int local_a4;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  Cell c;
  int local_74;
  int local_70;
  int j_1;
  int j;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int n;
  allocator local_41;
  string local_40 [8];
  string LTTRS;
  Player *player1_local;
  Board *board_local;
  Printer *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"ABCDEFGHJKLMNOPQRSTUVWXYZ",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  iVar1 = board->size;
  for (i_2 = 0; i_2 < iVar1 / 10 + 2; i_2 = i_2 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  for (i_3 = 0; i_3 < iVar1; i_3 = i_3 + 1) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)local_40);
    poVar4 = std::operator<<((ostream *)&std::cout,*pcVar3);
    std::operator<<(poVar4," ");
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  for (i_4 = 0; i_4 < iVar1 / 10 + 1; i_4 = i_4 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,"+");
  for (j = 0; j < iVar1; j = j + 1) {
    std::operator<<((ostream *)&std::cout,"--");
  }
  std::operator<<((ostream *)&std::cout,"+");
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  for (j_1 = 0; j_1 < iVar1; j_1 = j_1 + 1) {
    for (local_70 = 0; local_70 < iVar1 / 10 - j_1 / 10; local_70 = local_70 + 1) {
      std::operator<<((ostream *)&std::cout," ");
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j_1);
    std::operator<<(poVar4,"|");
    for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
      pCVar5 = Board::getCell(board,j_1,local_74);
      c._8_8_ = pCVar5->playerOwned;
      i_6 = pCVar5->row_coordinate;
      unique0x100003da = pCVar5->column_coordinate;
      c._0_8_ = *(undefined8 *)&pCVar5->occupied;
      bVar2 = Cell::isOccupied((Cell *)&i_6);
      if (bVar2) {
        pPVar6 = Cell::getPlayerOwned((Cell *)&i_6);
        if (pPVar6 == player1) {
          std::operator<<((ostream *)&std::cout,this->player1Icon);
        }
        else {
          std::operator<<((ostream *)&std::cout,this->player2Icon);
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,this->emptyCellIcon);
      }
      std::operator<<((ostream *)&std::cout," ");
      Cell::~Cell((Cell *)&i_6);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"|");
    std::ostream::operator<<(poVar4,j_1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  for (i_7 = 0; i_7 < iVar1 / 10 + 1; i_7 = i_7 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,"+");
  for (i_8 = 0; i_8 < iVar1; i_8 = i_8 + 1) {
    std::operator<<((ostream *)&std::cout,"--");
  }
  std::operator<<((ostream *)&std::cout,"+");
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  for (local_a4 = 0; local_a4 < iVar1 / 10 + 2; local_a4 = local_a4 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  for (local_a8 = 0; local_a8 < iVar1; local_a8 = local_a8 + 1) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)local_40);
    poVar4 = std::operator<<((ostream *)&std::cout,*pcVar3);
    std::operator<<(poVar4," ");
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Printer::printBoard(Board& board, const Player* player1){

  const string LTTRS = "ABCDEFGHJKLMNOPQRSTUVWXYZ";
  int n = board.size;

  // printing header
  for (int i=0; i<n/10+2; i++) cout << " "; // print offset created by row numbering
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();

  // printing each row
  for (int i=0; i<n; i++){

    // printing row numbering at left side
    for (int j=0; j<n/10-i/10; j++) cout << " "; // print trailing spaces for formatting
    cout << i << "|";

    for (int j=0; j<n; j++){

        Cell c = board.getCell(i,j);
        if (!c.isOccupied()) cout << this->emptyCellIcon;
        else if (c.getPlayerOwned() == player1) cout << this ->player1Icon;
        else cout << this->player2Icon;

        cout << " ";
    }
    // printing row numbering at the right side
    cout << "|" << i;
    cout.put(cout.widen('\n'));
    cout.flush();
  }

  // printing footer
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+2; i++) cout << " ";
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();

}